

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cpp
# Opt level: O2

bool __thiscall
slang::ast::ConstraintExprVisitor::visit<slang::ast::LValueReferenceExpression>
          (ConstraintExprVisitor *this,LValueReferenceExpression *expr)

{
  ExpressionKind EVar1;
  uint uVar2;
  int iVar3;
  Expression *this_00;
  long lVar4;
  bool bVar5;
  bool bVar6;
  RandMode RVar7;
  SubroutineKind SVar8;
  Symbol *symbol;
  variant_alternative_t<0UL,_variant<const_SubroutineSymbol_*,_SystemCallInfo>_> *ppSVar9;
  SourceLocation SVar10;
  long lVar11;
  DiagCode code;
  ASTContext *this_01;
  BinaryExpression *binExpr;
  ArgList AVar13;
  SourceRange sourceRange;
  DistVarVisitor distVisitor;
  SourceLocation SVar12;
  
  if ((this->failed != false) || (bVar5 = Expression::bad(&expr->super_Expression), bVar5))
  goto LAB_00297055;
  symbol = Expression::getSymbolReference(&expr->super_Expression,true);
  if ((symbol != (Symbol *)0x0) &&
     (((RVar7 = ASTContext::getRandMode(this->context,symbol), RVar7 != None &&
       (this->sawRandVars = true, RVar7 == RandC)) && (this->isSoft != false)))) {
    ASTContext::addDiag(this->context,(DiagCode)0x390008,(expr->super_Expression).sourceRange);
  }
  EVar1 = (expr->super_Expression).kind;
  bVar5 = true;
  switch(EVar1) {
  case IntegerLiteral:
    SVInt::SVInt((SVInt *)&distVisitor,(SVIntStorage *)&expr[1].super_Expression.type);
    goto LAB_00297089;
  case RealLiteral:
  case TimeLiteral:
    this_01 = this->context;
    if (0 < (int)(((this_01->scope).ptr)->compilation->options).languageVersion) break;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar10 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x2f;
    goto LAB_00297050;
  case UnbasedUnsizedIntegerLiteral:
    UnbasedUnsizedIntegerLiteral::getValue((UnbasedUnsizedIntegerLiteral *)&distVisitor);
LAB_00297089:
    SVInt::~SVInt((SVInt *)&distVisitor);
    if (distVisitor._13_1_ != '\x01') {
      return true;
    }
    this_01 = this->context;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar10 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x50;
    goto LAB_00297050;
  case NullLiteral:
  case UnboundedLiteral:
  case StringLiteral:
  case UnaryOp:
  case ConditionalOp:
  case Inside:
  case Assignment:
  case Concatenation:
  case Replication:
  case ElementSelect:
  case RangeSelect:
  case MemberAccess:
    break;
  case NamedValue:
  case HierarchicalValue:
    if (this->isTop == false) {
      return true;
    }
    break;
  case BinaryOp:
    uVar2 = *(uint *)&expr[1].super_Expression.constant;
    if ((uVar2 < 0x13) && ((0x61800U >> (uVar2 & 0x1f) & 1) != 0)) goto switchD_00296f7d_caseD_11;
    break;
  case Streaming:
switchD_00296f7d_caseD_11:
    this_01 = this->context;
    SVar12 = (expr->super_Expression).sourceRange.startLoc;
    SVar10 = (expr->super_Expression).sourceRange.endLoc;
    code.subsystem = Statements;
    code.code = 0x18;
LAB_00297050:
    sourceRange.endLoc = SVar10;
    sourceRange.startLoc = SVar12;
    ASTContext::addDiag(this_01,code,sourceRange);
    goto LAB_00297055;
  case Call:
    SVar8 = CallExpression::getSubroutineKind((CallExpression *)expr);
    if (SVar8 == Task) {
      this_01 = this->context;
      SVar12 = (expr->super_Expression).sourceRange.startLoc;
      SVar10 = (expr->super_Expression).sourceRange.endLoc;
      code.subsystem = Statements;
      code.code = 0x4b;
      goto LAB_00297050;
    }
    if ((char)expr[2].super_Expression.kind != IntegerLiteral) {
      ppSVar9 = std::
                get<0ul,slang::ast::SubroutineSymbol_const*,slang::ast::CallExpression::SystemCallInfo>
                          ((variant<const_slang::ast::SubroutineSymbol_*,_slang::ast::CallExpression::SystemCallInfo>
                            *)(expr + 1));
      AVar13 = SubroutineSymbol::getArguments(*ppSVar9);
      for (lVar11 = 0; AVar13._M_extent._M_extent_value._M_extent_value * 8 != lVar11;
          lVar11 = lVar11 + 8) {
        lVar4 = *(long *)((long)AVar13._M_ptr + lVar11);
        iVar3 = *(int *)(lVar4 + 0x158);
        if (iVar3 == 3) {
          if ((*(byte *)(lVar4 + 0x154) & 1) == 0) goto LAB_002970ff;
        }
        else if (iVar3 - 1U < 2) {
LAB_002970ff:
          this_01 = this->context;
          SVar12 = (expr->super_Expression).sourceRange.startLoc;
          SVar10 = (expr->super_Expression).sourceRange.endLoc;
          code.subsystem = Statements;
          code.code = 0x32;
          goto LAB_00297050;
        }
      }
    }
    break;
  default:
    switch(EVar1) {
    case ValueRange:
      return true;
    case Dist:
      distVisitor.context = this->context;
      distVisitor.anyRandVars = false;
      this_00 = *(Expression **)&expr[1].super_Expression;
      Expression::visit<slang::ast::DistVarVisitor&>(this_00,&distVisitor);
      if (distVisitor.anyRandVars != false) {
        return true;
      }
      ASTContext::addDiag(this->context,(DiagCode)0x3c0008,this_00->sourceRange);
      return true;
    case NewArray:
    case NewClass:
    case CopyClass:
      goto switchD_00296f7d_caseD_11;
    }
  }
  bVar6 = checkType(this,&expr->super_Expression);
  if (!bVar6) {
LAB_00297055:
    this->failed = true;
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool visit(const T& expr) {
        if (failed || expr.bad())
            return fail();

        if constexpr (std::is_base_of_v<Expression, T>) {
            if (auto sym = expr.getSymbolReference()) {
                RandMode mode = context.getRandMode(*sym);
                if (mode != RandMode::None)
                    sawRandVars = true;

                if (isSoft && mode == RandMode::RandC)
                    context.addDiag(diag::RandCInSoft, expr.sourceRange);
            }

            bool childrenHaveRand = false;

            if constexpr (HasVisitExprs<T, ConstraintExprVisitor>) {
                // Inside call and select expressions we don't care about the types.
                // This allows things like selections of associative arrays and built-in methods
                // on arrays of strings to work as long as the actual operators at the top level
                // don't have those types.
                if (expr.kind != ExpressionKind::ElementSelect &&
                    expr.kind != ExpressionKind::MemberAccess &&
                    expr.kind != ExpressionKind::Call) {

                    const bool oldTop = std::exchange(isTop, false);
                    const bool oldSawRand = std::exchange(sawRandVars, false);
                    expr.visitExprs(*this);
                    isTop = oldTop;
                    childrenHaveRand = sawRandVars;
                    sawRandVars = oldSawRand;
                }
            }

            switch (expr.kind) {
                case ExpressionKind::Streaming:
                case ExpressionKind::NewArray:
                case ExpressionKind::NewClass:
                case ExpressionKind::CopyClass:
                    context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                    return fail();
                case ExpressionKind::RealLiteral:
                case ExpressionKind::TimeLiteral:
                    if (context.getCompilation().languageVersion() < LanguageVersion::v1800_2023) {
                        context.addDiag(diag::NonIntegralConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    break;
                case ExpressionKind::IntegerLiteral:
                    if (expr.template as<IntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::UnbasedUnsizedIntegerLiteral:
                    if (expr.template as<UnbasedUnsizedIntegerLiteral>().getValue().hasUnknown()) {
                        context.addDiag(diag::UnknownConstraintLiteral, expr.sourceRange);
                        return fail();
                    }
                    return true;
                case ExpressionKind::BinaryOp: {
                    auto& binExpr = expr.template as<BinaryExpression>();
                    switch (binExpr.op) {
                        case BinaryOperator::CaseEquality:
                        case BinaryOperator::CaseInequality:
                        case BinaryOperator::WildcardEquality:
                        case BinaryOperator::WildcardInequality:
                            context.addDiag(diag::ExprNotConstraint, expr.sourceRange);
                            return fail();
                        case BinaryOperator::Equality:
                        case BinaryOperator::Inequality:
                        case BinaryOperator::GreaterThanEqual:
                        case BinaryOperator::GreaterThan:
                        case BinaryOperator::LessThanEqual:
                        case BinaryOperator::LessThan:
                        case BinaryOperator::LogicalAnd:
                        case BinaryOperator::LogicalOr:
                        case BinaryOperator::LogicalImplication:
                        case BinaryOperator::LogicalEquivalence:
                            // We previously ignored invalid types of NamedValues when
                            // we visited subexpressions. If there were any rand vars
                            // used in our subexpressions we should re-check named values
                            // for the stricter integral / numeric type requirements.
                            if (childrenHaveRand) {
                                if (ValueExpressionBase::isKind(binExpr.left().kind) &&
                                    !checkType(binExpr.left())) {
                                    return fail();
                                }

                                if (ValueExpressionBase::isKind(binExpr.right().kind) &&
                                    !checkType(binExpr.right())) {
                                    return fail();
                                }
                            }
                            break;
                        default:
                            break;
                    }
                    break;
                }
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue:
                    if (!isTop)
                        return true;
                    break;
                case ExpressionKind::ValueRange:
                    return true;
                case ExpressionKind::Dist: {
                    // Additional restrictions on dist expressions:
                    // - must contain at least one 'rand' var
                    // - cannot contain any 'randc' vars
                    DistVarVisitor distVisitor(context);
                    auto& left = expr.template as<DistExpression>().left();
                    left.visit(distVisitor);
                    if (!distVisitor.anyRandVars)
                        context.addDiag(diag::RandNeededInDist, left.sourceRange);
                    return true;
                }
                case ExpressionKind::Call: {
                    auto& call = expr.template as<CallExpression>();
                    if (call.getSubroutineKind() == SubroutineKind::Task) {
                        context.addDiag(diag::TaskInConstraint, expr.sourceRange);
                        return fail();
                    }

                    if (!call.isSystemCall()) {
                        const SubroutineSymbol& sub = *std::get<0>(call.subroutine);
                        for (auto arg : sub.getArguments()) {
                            if (arg->direction == ArgumentDirection::Out ||
                                arg->direction == ArgumentDirection::InOut ||
                                (arg->direction == ArgumentDirection::Ref &&
                                 !arg->flags.has(VariableFlags::Const))) {
                                context.addDiag(diag::OutRefFuncConstraint, expr.sourceRange);
                                return fail();
                            }
                        }
                    }
                    break;
                }
                default:
                    break;
            }

            if (!checkType(expr))
                return fail();
        }

        return true;
    }